

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_maint(store *s)

{
  bitflag *pbVar1;
  byte bVar2;
  object_kind **ppoVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  object *poVar9;
  object_kind *poVar10;
  object *poVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  wchar_t t;
  int iVar17;
  object *obj;
  object *local_58;
  int local_4c;
  object *local_48;
  object *local_40;
  int local_38;
  int local_34;
  
  if (s->sidx != store_home_idx) {
    if (s->sidx == store_black_market_idx) {
      poVar11 = s->stock;
      while (poVar9 = poVar11, poVar9 != (object *)0x0) {
        poVar11 = poVar9->next;
        _Var4 = black_market_ok(s->town,poVar9);
        if (!_Var4) {
          if (poVar9->artifact != (artifact *)0x0) {
            history_lose_artifact(player,poVar9->artifact);
          }
          store_delete(s,poVar9,(uint)poVar9->number);
        }
      }
    }
    if (s->turnover == L'\0') {
      if ((s->always_num != 0) && (s->stock_num != 0)) {
        uVar6 = Rand_div((uint)s->stock_num);
        for (iVar14 = uVar6 + 1; iVar14 != 0; iVar14 = iVar14 + -1) {
          store_delete_random(s);
        }
      }
    }
    else {
      bVar2 = s->stock_num;
      uVar6 = Rand_div(s->turnover);
      wVar7 = ~uVar6 + (uint)bVar2;
      wVar8 = L'\0';
      if (L'\0' < wVar7) {
        wVar8 = wVar7;
      }
      if (s->normal_stock_max <= wVar8) {
        wVar8 = s->normal_stock_max;
      }
      if (wVar8 < (int)(uint)s->stock_num) {
        iVar14 = -100000;
        do {
          iVar14 = iVar14 + 1;
          if (iVar14 == 0) {
            quit_fmt("Unable to (de-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
            break;
          }
          store_delete_random(s);
        } while (wVar8 < (int)(uint)s->stock_num);
      }
    }
    if (s->always_num != 0) {
      uVar16 = 0;
      do {
        poVar10 = s->always_table[uVar16];
        if (poVar10 == (object_kind *)0x0) {
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                        ,0x4d3,
                        "struct object *store_find_kind(struct store *, struct object_kind *, _Bool (*)(struct store *, struct object *))"
                       );
        }
        for (poVar11 = s->stock; poVar11 != (object *)0x0; poVar11 = poVar11->next) {
          if ((poVar11->kind == poVar10) &&
             (_Var4 = store_sale_should_reduce_stock(s,poVar11), !_Var4)) goto LAB_001cece8;
        }
        poVar9 = object_new();
        local_58 = poVar9;
        poVar11 = object_new();
        local_40 = poVar11;
        object_prep(poVar9,poVar10,L'\0',RANDOMISE);
        if (poVar9->artifact != (artifact *)0x0) {
          __assert_fail("!obj->artifact",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                        ,0x5d2,
                        "struct object *store_create_item(struct store *, struct object_kind *)");
        }
        poVar9->known = poVar11;
        poVar11->notice = poVar11->notice | 2;
        object_set_base_known(player,poVar9);
        pbVar1 = &poVar9->known->notice;
        *pbVar1 = *pbVar1 | 2;
        player_know_object(player,poVar9);
        poVar9->origin = '\0';
        poVar11 = store_carry(s,poVar9);
        if (poVar11 == (object *)0x0) {
          object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
          poVar9->known = (object *)0x0;
          object_delete((chunk *)0x0,(chunk *)0x0,&local_58);
        }
        else {
LAB_001cece8:
          uVar5 = (uint8_t)poVar11->kind->base->max_stack;
          poVar11->number = uVar5;
          poVar11->known->number = uVar5;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < s->always_num);
    }
    if (s->turnover != L'\0') {
      bVar2 = s->stock_num;
      uVar6 = Rand_div(s->turnover);
      iVar14 = uVar6 + bVar2 + 1;
      local_4c = (int)s->always_num;
      iVar12 = s->normal_stock_min + local_4c;
      local_4c = local_4c + s->normal_stock_max;
      if (iVar14 < local_4c) {
        local_4c = iVar14;
      }
      if (local_4c <= iVar12) {
        local_4c = iVar12;
      }
      if ((int)(uint)s->stock_num < local_4c) {
        iVar14 = 100000;
        iVar12 = local_4c;
        do {
          if (iVar14 + -1 == 0) {
            quit_fmt("Unable to (re-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
            return;
          }
          if (s->sidx == store_black_market_idx) {
            local_34 = player->max_depth + 5;
            iVar13 = player->max_depth + 0x14;
          }
          else {
            iVar13 = player->max_depth + -0x14;
            if (player->max_depth < 0x14) {
              iVar13 = 0;
            }
            iVar13 = iVar13 + (uint)z_info->store_magic_level;
            local_34 = 1;
          }
          if (0x36 < local_34) {
            local_34 = 0x37;
          }
          if (0x45 < iVar13) {
            iVar13 = 0x46;
          }
          iVar15 = 0;
          local_38 = iVar14 + -1;
          do {
            wVar8 = rand_range(local_34,iVar13);
            if (s->sidx == store_black_market_idx) {
              poVar10 = get_obj_num(wVar8,false,L'\0');
            }
            else {
              ppoVar3 = s->normal_table;
              uVar6 = Rand_div((uint32_t)s->normal_num);
              poVar10 = ppoVar3[(int)uVar6];
            }
            if (poVar10->tval != L'\x01') {
              local_58 = object_new();
              object_prep(local_58,poVar10,wVar8,RANDOMISE);
              apply_magic(local_58,wVar8,false,false,false,false);
              if (local_58->artifact != (artifact *)0x0) {
                __assert_fail("!obj->artifact",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                              ,0x58b,"_Bool store_create_random(struct store *)");
              }
              _Var4 = tval_is_weapon(local_58);
              if ((((!_Var4) || ((-1 < local_58->to_h && (-1 < local_58->to_d)))) &&
                  ((_Var4 = tval_is_armor(local_58), !_Var4 || (-1 < local_58->to_a)))) &&
                 (local_58->curses == (curse_data *)0x0)) {
                local_40 = object_new();
                local_58->known = local_40;
                local_40->notice = local_40->notice | 2;
                object_set_base_known(player,local_58);
                pbVar1 = &local_58->known->notice;
                *pbVar1 = *pbVar1 | 2;
                player_know_object(player,local_58);
                local_58->origin = '\0';
                if (((s->sidx != store_black_market_idx) ||
                    (_Var4 = black_market_ok(s->town,local_58), _Var4)) &&
                   (wVar8 = object_value_real(local_58,L'\x01'), poVar11 = local_58, L'\0' < wVar8))
                {
                  wVar7 = L'\x01';
                  wVar8 = object_value_real(local_58,L'\x01');
                  switch(poVar11->tval) {
                  case '\x02':
                  case '\x03':
                  case '\x04':
                    if (wVar8 < L'\x06') {
                      uVar6 = Rand_div(2);
                      wVar7 = uVar6 * 0x14 + L'\x14';
                    }
                    else if ((uint)wVar8 < 0x33) {
                      uVar6 = Rand_div(4);
                      wVar7 = uVar6 * 10 + L'\n';
                    }
                    else if ((uint)wVar8 < 0x1f5) {
                      uVar6 = Rand_div(4);
                      wVar7 = uVar6 * 5 + L'\x05';
                    }
                    break;
                  case '\x05':
                  case '\x06':
                  case '\a':
                  case '\b':
                  case '\t':
                  case '\n':
                  case '\v':
                  case '\f':
                  case '\r':
                  case '\x0e':
                  case '\x0f':
                  case '\x10':
                  case '\x11':
                    if (poVar11->ego == (ego_item *)0x0) {
                      wVar7 = L'\x01';
                      if (wVar8 < L'\v') {
                        iVar12 = 0;
                        iVar14 = 3;
                        do {
                          uVar6 = Rand_div(5);
                          iVar12 = iVar12 + uVar6;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                        wVar7 = iVar12 + L'\x01';
                        iVar12 = local_4c;
                      }
                      if (wVar8 < L'e') {
                        local_48 = poVar11;
                        iVar12 = 0;
                        iVar14 = 3;
                        do {
                          uVar6 = Rand_div(5);
                          iVar12 = iVar12 + uVar6;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                        goto LAB_001cf0a4;
                      }
                    }
                    break;
                  case '\x13':
                  case '\x1b':
                  case '\x1c':
                  case '\x1d':
                    wVar7 = L'\x01';
                    local_48 = poVar11;
                    if (wVar8 < L'\x06') {
                      iVar17 = 0;
                      iVar14 = 3;
                      do {
                        uVar6 = Rand_div(5);
                        iVar17 = iVar17 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar17 + L'\x01';
                    }
                    poVar11 = local_48;
                    if (wVar8 < L'\x15') {
                      iVar12 = 0;
                      iVar14 = 3;
                      do {
                        uVar6 = Rand_div(5);
                        iVar12 = iVar12 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
LAB_001cf0a4:
                      wVar7 = wVar7 + iVar12;
                      poVar11 = local_48;
                      iVar12 = local_4c;
                    }
                    break;
                  case '\x19':
                  case '\x1a':
                    wVar7 = L'\x01';
                    if (wVar8 < L'=') {
                      iVar12 = 0;
                      iVar14 = 3;
                      do {
                        uVar6 = Rand_div(5);
                        iVar12 = iVar12 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar12 + L'\x01';
                      iVar12 = local_4c;
                    }
                    if (wVar8 < L'ñ') {
                      uVar6 = 5;
LAB_001cf111:
                      uVar6 = Rand_div(uVar6);
                      wVar7 = wVar7 + uVar6;
                    }
                    break;
                  case '\x1e':
                  case '\x1f':
                  case ' ':
                  case '!':
                  case '\"':
                    wVar7 = L'\x01';
                    if (wVar8 < L'3') {
                      iVar12 = 0;
                      iVar14 = 2;
                      do {
                        uVar6 = Rand_div(3);
                        iVar12 = iVar12 + uVar6;
                        iVar14 = iVar14 + -1;
                      } while (iVar14 != 0);
                      wVar7 = iVar12 + L'\x01';
                      iVar12 = local_4c;
                    }
                    if (wVar8 < L'ǵ') {
                      uVar6 = 3;
                      goto LAB_001cf111;
                    }
                  }
                  wVar8 = poVar11->kind->base->max_stack;
                  uVar5 = (uint8_t)wVar8;
                  if (wVar7 < wVar8) {
                    uVar5 = (uint8_t)wVar7;
                  }
                  poVar11->number = uVar5;
                  poVar11 = store_carry(s,local_58);
                  if (poVar11 != (object *)0x0) break;
                }
                object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
                local_58->known = (object *)0x0;
              }
              object_delete((chunk *)0x0,(chunk *)0x0,&local_58);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 != 6);
          iVar14 = local_38;
        } while ((int)(uint)s->stock_num < iVar12);
      }
    }
  }
  return;
}

Assistant:

static void store_maint(struct store *s)
{
	/* Ignore home */
	if (store_is_home(s))
		return;

	/* Destroy crappy black market items */
	if (store_is_black_market(s)) {
		struct object *obj = s->stock;
		while (obj) {
			struct object *next = obj->next;
			if (!black_market_ok(s->town, obj)) {
				if (obj->artifact) {
					history_lose_artifact(player,
										  obj->artifact);
				}
				store_delete(s, obj, obj->number);
			}
			obj = next;
		}
	}

	/* We want to make sure stores have staple items. If there's
	 * turnover, we also want to delete a few items, and add a few
	 * items.
	 *
	 * If we create staple items, then delete items, then create new
	 * items, we are stuck with one of three choices:
	 * 1. We can risk deleting staple items, and not having any left.
	 * 2. We can refuse to delete staple items, and risk having that
	 * become an infinite loop.
	 * 3. We can do a ton of extra bookkeeping to make sure we delete
	 * staple items only if there's duplicates of them.
	 *
	 * What if we change the order? First sell a handful of random items,
	 * then create any missing staples, then create new items. This
	 * has two tests for s->turnover, but simplifies everything else
	 * dramatically.
	 */

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num - randint1(s->turnover);

		/* We'll end up adding staples for sure, maybe plus other
		 * items. It's fine if we sell out completely, though, if
		 * turnover is high. The cap doesn't include always_num,
		 * because otherwise the addition of missing staples could
		 * put us over (if the store was full of player-sold loot).
		 */
		int min = 0;
		int max = s->normal_stock_max;

		if (stock < min) stock = min;
		if (stock > max) stock = max;

		/* Destroy random objects until only "stock" slots are left */
		while (s->stock_num > stock && --restock_attempts)
			store_delete_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (de-)stock store %d. Please report this bug",
					 s->sidx + 1);
	} else {
		/* For the Bookseller, occasionally sell a book */
		if (s->always_num && s->stock_num) {
			int sales = randint1(s->stock_num);
			while (sales--) {
				store_delete_random(s);
			}
		}
	}

	/* Ensure staples are created */
	if (s->always_num) {
		size_t i;
		for (i = 0; i < s->always_num; i++) {
			struct object_kind *kind = s->always_table[i];
			struct object *obj = store_find_kind(s, kind,
				store_sale_should_reduce_stock);

			/* Create the item if it doesn't exist */
			if (!obj) {
				obj = store_create_item(s, kind);
				if (!obj) continue;
			}

			/* Ensure a full stack */
			obj->number = obj->kind->base->max_stack;
			obj->known->number = obj->kind->base->max_stack;
		}
	}

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num + randint1(s->turnover);

		/* Now that the staples exist, we want to add more
		 * items, at least enough to get us to normal_stock_min
		 * items that aren't necessarily staples.
		 */

		int min = s->normal_stock_min + s->always_num;
		int max = s->normal_stock_max + s->always_num;

		/* Buy a few items */

		/* Keep stock between specified min and max slots */
		if (stock > max) stock = max;
		if (stock < min) stock = min;

		/* For the rest, we just choose items randomlyish */
		/* The (huge) restock_attempts will only go to zero (otherwise
		 * infinite loop) if stores don't have enough items they can stock! */
		while (s->stock_num < stock && --restock_attempts)
			store_create_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (re-)stock store %d. Please report this bug",
					 s->sidx + 1);
	}
}